

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

quad<unsigned_char> __thiscall
charls::jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
::decode_run_interruption_pixel
          (jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
           *this,quad<unsigned_char> ra,quad<unsigned_char> rb)

{
  int32_t iVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  reference pvVar6;
  uchar *in_RCX;
  uchar *puVar7;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  size_t *siglen_02;
  uchar *sig;
  uint uVar8;
  array<charls::context_run_mode,_2UL> *this_00;
  size_t in_R8;
  triplet<unsigned_char> local_38;
  triplet<unsigned_char> local_33;
  int32_t local_30;
  int32_t local_2c;
  int32_t error_value4;
  int32_t error_value3;
  int32_t error_value2;
  int32_t error_value1;
  jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
  *this_local;
  quad<unsigned_char> local_10;
  quad<unsigned_char> rb_local;
  quad<unsigned_char> ra_local;
  
  this_00 = &this->context_run_mode_;
  _error_value2 = this;
  this_local._4_4_ = rb;
  local_10 = ra;
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_00,0);
  error_value3 = decode_run_interruption_error(this,pvVar6);
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_00,0);
  error_value4 = decode_run_interruption_error(this,pvVar6);
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_00,0);
  local_2c = decode_run_interruption_error(this,pvVar6);
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_00,0);
  local_30 = decode_run_interruption_error(this,pvVar6);
  iVar1 = error_value3;
  uVar8 = (uint)this_local._4_4_ & 0xff;
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar8 - ((uint)local_10 & 0xff)),(uchar *)pvVar6,
                       siglen,in_RCX,in_R8);
  puVar7 = (uchar *)(ulong)(uint)(iVar1 * iVar5);
  bVar2 = lossless_traits<charls::quad<unsigned_char>,_8>::compute_reconstructed_sample
                    (uVar8,iVar1 * iVar5);
  iVar1 = error_value4;
  uVar8 = (uint)this_local._4_4_ >> 8 & 0xff;
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar8 - ((uint)local_10 >> 8 & 0xff)),puVar7,
                       siglen_00,in_RCX,in_R8);
  puVar7 = (uchar *)(ulong)(uint)(iVar1 * iVar5);
  bVar3 = lossless_traits<charls::quad<unsigned_char>,_8>::compute_reconstructed_sample
                    (uVar8,iVar1 * iVar5);
  iVar1 = local_2c;
  uVar8 = (uint)this_local._4_4_ >> 0x10 & 0xff;
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar8 - ((uint)local_10 >> 0x10 & 0xff)),puVar7,
                       siglen_01,in_RCX,in_R8);
  bVar4 = lossless_traits<charls::quad<unsigned_char>,_8>::compute_reconstructed_sample
                    (uVar8,iVar1 * iVar5);
  sig = (uchar *)(ulong)(uint)bVar2;
  puVar7 = (uchar *)(ulong)bVar4;
  triplet<unsigned_char>::triplet(&local_33,(uint)bVar2,(uint)bVar3,(uint)bVar4);
  iVar1 = local_30;
  uVar8 = (uint)this_local._4_4_ >> 0x18;
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar8 - ((uint)local_10 >> 0x18)),sig,siglen_02,
                       puVar7,in_R8);
  bVar2 = lossless_traits<charls::quad<unsigned_char>,_8>::compute_reconstructed_sample
                    (uVar8,iVar1 * iVar5);
  local_38.field_2.v3 = local_33.field_2.v3;
  local_38.field_0 = local_33.field_0;
  local_38.field_1 = local_33.field_1;
  quad<unsigned_char>::quad(&rb_local,local_38,(uint)bVar2);
  return rb_local;
}

Assistant:

quad<sample_type> decode_run_interruption_pixel(quad<sample_type> ra, quad<sample_type> rb)
    {
        const int32_t error_value1{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value2{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value3{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value4{decode_run_interruption_error(context_run_mode_[0])};

        return quad<sample_type>(
            triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                 traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                 traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3))),
            traits_.compute_reconstructed_sample(rb.v4, error_value4 * sign(rb.v4 - ra.v4)));
    }